

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Record.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  string local_950;
  string local_930;
  allocator<char> local_909;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  undefined1 local_898 [8];
  Record rec_6;
  undefined1 local_820 [8];
  string str_6;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  undefined1 local_748 [8];
  Record rec_5;
  undefined1 local_6d0 [8];
  string str_5;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  undefined1 local_5f8 [8];
  Record rec_4;
  undefined1 local_580 [8];
  string str_4;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  undefined1 local_4a8 [8];
  Record rec_3;
  undefined1 local_430 [8];
  string str_3;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  undefined1 local_358 [8];
  Record rec_2;
  undefined1 local_2e0 [8];
  string str_2;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  undefined1 local_208 [8];
  Record rec_1;
  undefined1 local_190 [8];
  string str_1;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  Record rec;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string str;
  int result;
  
  str.field_2._12_4_ = 0;
  str.field_2._8_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"frames/100/log.txt",&local_31);
  std::allocator<char>::~allocator(&local_31);
  gtar::Record::Record((Record *)local_b8,(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"log.txt",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"100",&local_129);
  bVar1 = check((Record *)local_b8,&local_d8,&local_100,&local_128,Discrete,UInt8,Text,true,0x2f);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  skipAbsolute(&local_150,(string *)local_30);
  gtar::Record::getPath_abi_cxx11_((string *)((long)&str_1.field_2 + 8),(Record *)local_b8);
  bVar1 = checkstr(&local_150,(string *)((long)&str_1.field_2 + 8),true,0x30);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)(str_1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_150);
  gtar::Record::~Record((Record *)local_b8);
  std::__cxx11::string::~string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,"frames/100/log.txt",(allocator<char> *)&rec_1.field_0x6f);
  std::allocator<char>::~allocator((allocator<char> *)&rec_1.field_0x6f);
  gtar::Record::Record((Record *)local_208,(string *)local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"lo.txt",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"100",&local_279);
  bVar1 = check((Record *)local_208,&local_228,&local_250,&local_278,Discrete,UInt8,Text,false,0x36)
  ;
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  skipAbsolute(&local_2a0,(string *)local_190);
  gtar::Record::getPath_abi_cxx11_((string *)((long)&str_2.field_2 + 8),(Record *)local_208);
  bVar1 = checkstr(&local_2a0,(string *)((long)&str_2.field_2 + 8),true,0x37);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)(str_2.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_2a0);
  gtar::Record::~Record((Record *)local_208);
  std::__cxx11::string::~string((string *)local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e0,"frames/100/position.f32.ind",(allocator<char> *)&rec_2.field_0x6f)
  ;
  std::allocator<char>::~allocator((allocator<char> *)&rec_2.field_0x6f);
  gtar::Record::Record((Record *)local_358,(string *)local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"position",&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"100",&local_3c9);
  bVar1 = check((Record *)local_358,&local_378,&local_3a0,&local_3c8,Discrete,Float32,Individual,
                true,0x3d);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  skipAbsolute(&local_3f0,(string *)local_2e0);
  gtar::Record::getPath_abi_cxx11_((string *)((long)&str_3.field_2 + 8),(Record *)local_358);
  bVar1 = checkstr(&local_3f0,(string *)((long)&str_3.field_2 + 8),true,0x3e);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)(str_3.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_3f0);
  gtar::Record::~Record((Record *)local_358);
  std::__cxx11::string::~string((string *)local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_430,"velocity.u64.uni",(allocator<char> *)&rec_3.field_0x6f);
  std::allocator<char>::~allocator((allocator<char> *)&rec_3.field_0x6f);
  gtar::Record::Record((Record *)local_4a8,(string *)local_430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"velocity",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"",&local_519);
  bVar1 = check((Record *)local_4a8,&local_4c8,&local_4f0,&local_518,Constant,UInt64,Uniform,true,
                0x44);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  skipAbsolute(&local_540,(string *)local_430);
  gtar::Record::getPath_abi_cxx11_((string *)((long)&str_4.field_2 + 8),(Record *)local_4a8);
  bVar1 = checkstr(&local_540,(string *)((long)&str_4.field_2 + 8),true,0x45);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)(str_4.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_540);
  gtar::Record::~Record((Record *)local_4a8);
  std::__cxx11::string::~string((string *)local_430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_580,"/vars/stdout.txt/12",(allocator<char> *)&rec_4.field_0x6f);
  std::allocator<char>::~allocator((allocator<char> *)&rec_4.field_0x6f);
  gtar::Record::Record((Record *)local_5f8,(string *)local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"stdout.txt",&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"12",&local_669);
  bVar1 = check((Record *)local_5f8,&local_618,&local_640,&local_668,Continuous,UInt8,Text,true,0x4b
               );
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  skipAbsolute(&local_690,(string *)local_580);
  gtar::Record::getPath_abi_cxx11_((string *)((long)&str_5.field_2 + 8),(Record *)local_5f8);
  bVar1 = checkstr(&local_690,(string *)((long)&str_5.field_2 + 8),true,0x4c);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)(str_5.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_690);
  gtar::Record::~Record((Record *)local_5f8);
  std::__cxx11::string::~string((string *)local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6d0,"/rigid_body/frames/0/angular_momentum.f64.ind",
             (allocator<char> *)&rec_5.field_0x6f);
  std::allocator<char>::~allocator((allocator<char> *)&rec_5.field_0x6f);
  gtar::Record::Record((Record *)local_748,(string *)local_6d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"rigid_body",&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"angular_momentum",&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"0",&local_7b9);
  bVar1 = check((Record *)local_748,&local_768,&local_790,&local_7b8,Discrete,Float64,Individual,
                true,0x52);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator(&local_791);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  skipAbsolute(&local_7e0,(string *)local_6d0);
  gtar::Record::getPath_abi_cxx11_((string *)((long)&str_6.field_2 + 8),(Record *)local_748);
  bVar1 = checkstr(&local_7e0,(string *)((long)&str_6.field_2 + 8),true,0x53);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)(str_6.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_7e0);
  gtar::Record::~Record((Record *)local_748);
  std::__cxx11::string::~string((string *)local_6d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_820,"frame/2000/position.f32.ind",(allocator<char> *)&rec_6.field_0x6f)
  ;
  std::allocator<char>::~allocator((allocator<char> *)&rec_6.field_0x6f);
  gtar::Record::Record((Record *)local_898,(string *)local_820);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"frame/2000",&local_8b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"position",&local_8e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"",&local_909);
  bVar1 = check((Record *)local_898,&local_8b8,&local_8e0,&local_908,Constant,Float32,Individual,
                true,0x59);
  str.field_2._8_4_ = str.field_2._8_4_ | (uint)bVar1;
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator(&local_909);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator(&local_8e1);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::allocator<char>::~allocator(&local_8b9);
  skipAbsolute(&local_930,(string *)local_820);
  gtar::Record::getPath_abi_cxx11_(&local_950,(Record *)local_898);
  bVar1 = checkstr(&local_930,&local_950,true,0x5a);
  str.field_2._8_4_ = (uint)bVar1 | str.field_2._8_4_;
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_930);
  gtar::Record::~Record((Record *)local_898);
  std::__cxx11::string::~string((string *)local_820);
  return str.field_2._8_4_;
}

Assistant:

int main()
{
    int result(0);

    {
        string str("frames/100/log.txt");
        Record rec(str);
        result |= check(rec, "", "log.txt", "100", Discrete, UInt8, Text, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("frames/100/log.txt");
        Record rec(str);
        result |= check(rec, "", "lo.txt", "100", Discrete, UInt8, Text, false, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("frames/100/position.f32.ind");
        Record rec(str);
        result |= check(rec, "", "position", "100", Discrete, Float32, Individual, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("velocity.u64.uni");
        Record rec(str);
        result |= check(rec, "", "velocity", "", Constant, UInt64, Uniform, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("/vars/stdout.txt/12");
        Record rec(str);
        result |= check(rec, "", "stdout.txt", "12", Continuous, UInt8, Text, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("/rigid_body/frames/0/angular_momentum.f64.ind");
        Record rec(str);
        result |= check(rec, "rigid_body", "angular_momentum", "0", Discrete, Float64, Individual, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    {
        string str("frame/2000/position.f32.ind");
        Record rec(str);
        result |= check(rec, "frame/2000", "position", "", Constant, Float32, Individual, true, __LINE__);
        result |= checkstr(skipAbsolute(str), rec.getPath(), true, __LINE__);
    }

    return result;
}